

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O2

bool __thiscall
solitaire::events::EventsProcessor::tryAddCardOnFoundationPileIfCollidesAndCheckIfHandEmpty
          (EventsProcessor *this,PileId *id,MouseLeftButtonUpEventData *eventData)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  PileId local_18;
  uint local_14;
  EventsProcessor *this_00;
  
  local_14 = id->t;
  iVar2 = (*this->context->_vptr_Context[6])();
  this_00 = (EventsProcessor *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(this_00->super_EventsProcessor)._vptr_EventsProcessor[3])
                    (this_00,&eventData->cardsInHandPosition);
  if ((char)iVar2 == '\0') {
    bVar1 = false;
  }
  else {
    _local_18 = CONCAT44(local_14,id->t);
    bVar1 = tryAddCardOnFoundationPileAndCheckIfHandEmpty(this_00,&local_18,eventData);
  }
  return bVar1;
}

Assistant:

bool EventsProcessor::tryAddCardOnFoundationPileIfCollidesAndCheckIfHandEmpty(
    const PileId id, const MouseLeftButtonUpEventData& eventData) const
{
    const auto& collider = context.getFoundationPileCollider(id);
    return collider.collidesWithCardsInHand(eventData.cardsInHandPosition) and
           tryAddCardOnFoundationPileAndCheckIfHandEmpty(id, eventData);
}